

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

ostream * __thiscall nivalis::Environment::to_bin(Environment *this,ostream *os)

{
  pointer pdVar1;
  pointer pUVar2;
  ulong uVar3;
  long lVar4;
  double local_38;
  
  local_38 = (double)((long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start >> 3);
  std::ostream::write((char *)os,(long)&local_38);
  pdVar1 = (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    uVar3 = 0;
    do {
      local_38 = pdVar1[uVar3];
      std::ostream::write((char *)os,(long)&local_38);
      uVar3 = uVar3 + 1;
      pdVar1 = (this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->vars).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  local_38 = (double)(((long)(this->funcs).
                             super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->funcs).
                             super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
  std::ostream::write((char *)os,(long)&local_38);
  pUVar2 = (this->funcs).
           super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->funcs).
      super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar2) {
    lVar4 = 0x50;
    uVar3 = 0;
    do {
      Expr::to_bin((Expr *)((long)pUVar2 + lVar4 + -0x30),os);
      local_38 = *(double *)
                  ((long)&(((this->funcs).
                            super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                  lVar4);
      std::ostream::write((char *)os,(long)&local_38);
      uVar3 = uVar3 + 1;
      pUVar2 = (this->funcs).
               super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x58;
    } while (uVar3 < (ulong)(((long)(this->funcs).
                                    super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 3)
                            * 0x2e8ba2e8ba2e8ba3));
  }
  return os;
}

Assistant:

std::ostream& Environment::to_bin(std::ostream& os) const {
    util::write_bin(os, vars.size());
    for (size_t i = 0; i < vars.size(); ++i) {
        util::write_bin(os, vars[i]);
    }
    util::write_bin(os, funcs.size());
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].expr.to_bin(os);
        util::write_bin(os, funcs[i].n_args);
    }
    return os;
}